

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O1

int Ssw_ManSweepBmc(Ssw_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Bar_Progress_t *p_00;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  Aig_Obj_t *p1;
  int iVar9;
  uint uVar10;
  Aig_Obj_t *pAVar11;
  long lVar12;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pAVar3 = Aig_ManStart(p->pPars->nFramesK * p->pAig->vObjs->nSize);
  p->pFrames = pAVar3;
  pAVar3 = p->pAig;
  if (0 < pAVar3->nRegs) {
    iVar2 = 0;
    do {
      uVar7 = pAVar3->nTruePis + iVar2;
      if (((int)uVar7 < 0) || (pAVar3->vCis->nSize <= (int)uVar7)) {
LAB_006abd14:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p->pNodeToFrames[(long)*(int *)((long)pAVar3->vCis->pArray[uVar7] + 0x24) * (long)p->nFrames]
           = (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1);
      iVar2 = iVar2 + 1;
      pAVar3 = p->pAig;
    } while (iVar2 < pAVar3->nRegs);
  }
  p->fRefined = 0;
  if (p->pPars->fVerbose == 0) {
    p_00 = (Bar_Progress_t *)0x0;
  }
  else {
    p_00 = Bar_ProgressStart(_stdout,p->pPars->nFramesK * pAVar3->vObjs->nSize);
  }
  if (0 < p->pPars->nFramesK) {
    iVar2 = 0;
    do {
      p->pNodeToFrames[p->pAig->pConst1->Id * p->nFrames + iVar2] = p->pFrames->pConst1;
      pAVar3 = p->pAig;
      if (0 < pAVar3->nTruePis) {
        lVar12 = 0;
        do {
          if (pAVar3->vCis->nSize <= lVar12) goto LAB_006abd14;
          pvVar1 = pAVar3->vCis->pArray[lVar12];
          pAVar4 = Aig_ObjCreateCi(p->pFrames);
          p->pNodeToFrames[*(int *)((long)pvVar1 + 0x24) * p->nFrames + iVar2] = pAVar4;
          lVar12 = lVar12 + 1;
          pAVar3 = p->pAig;
        } while (lVar12 < pAVar3->nTruePis);
      }
      pAVar3 = p->pAig;
      if (0 < pAVar3->nRegs) {
        iVar9 = 0;
        do {
          uVar7 = pAVar3->nTruePis + iVar9;
          if (((int)uVar7 < 0) || (pAVar3->vCis->nSize <= (int)uVar7)) goto LAB_006abd14;
          uVar7 = Ssw_ManSweepNode(p,(Aig_Obj_t *)pAVar3->vCis->pArray[uVar7],iVar2,1,
                                   (Vec_Int_t *)0x0);
          p->fRefined = p->fRefined | uVar7;
          iVar9 = iVar9 + 1;
          pAVar3 = p->pAig;
        } while (iVar9 < pAVar3->nRegs);
      }
      pVVar5 = p->pAig->vObjs;
      uVar6 = (ulong)(uint)pVVar5->nSize;
      if (0 < pVVar5->nSize) {
        lVar12 = 0;
        do {
          pAVar4 = (Aig_Obj_t *)pVVar5->pArray[lVar12];
          if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7))
          {
            if ((p->pPars->fVerbose != 0) &&
               ((iVar9 = (int)uVar6 * iVar2 + (int)lVar12, p_00 == (Bar_Progress_t *)0x0 ||
                (p_00->nItemsNext <= iVar9)))) {
              Bar_ProgressUpdate_int(p_00,iVar9,(char *)0x0);
            }
            if (((ulong)pAVar4 & 1) != 0) goto LAB_006abd33;
            uVar6 = (ulong)pAVar4->pFanin0 & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              pAVar11 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar11 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar4->pFanin0 & 1) ^
                        (ulong)p->pNodeToFrames[*(int *)(uVar6 + 0x24) * p->nFrames + iVar2]);
            }
            uVar6 = (ulong)pAVar4->pFanin1 & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar4->pFanin1 & 1) ^
                   (ulong)p->pNodeToFrames[*(int *)(uVar6 + 0x24) * p->nFrames + iVar2]);
            }
            pAVar11 = Aig_And(p->pFrames,pAVar11,p1);
            p->pNodeToFrames[pAVar4->Id * p->nFrames + iVar2] = pAVar11;
            uVar7 = Ssw_ManSweepNode(p,pAVar4,iVar2,1,(Vec_Int_t *)0x0);
            p->fRefined = p->fRefined | uVar7;
          }
          lVar12 = lVar12 + 1;
          pVVar5 = p->pAig->vObjs;
          uVar6 = (ulong)pVVar5->nSize;
        } while (lVar12 < (long)uVar6);
      }
      if (iVar2 == p->pPars->nFramesK + -1) break;
      pVVar5 = p->pAig->vCos;
      if (0 < pVVar5->nSize) {
        lVar12 = 0;
        do {
          pvVar1 = pVVar5->pArray[lVar12];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_006abd33:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                     (ulong)p->pNodeToFrames[*(int *)(uVar6 + 0x24) * p->nFrames + iVar2]);
          }
          p->pNodeToFrames[*(int *)((long)pvVar1 + 0x24) * p->nFrames + iVar2] = pAVar4;
          lVar12 = lVar12 + 1;
          pVVar5 = p->pAig->vCos;
        } while (lVar12 < pVVar5->nSize);
      }
      pAVar3 = p->pAig;
      if (0 < pAVar3->nRegs) {
        iVar9 = 0;
        do {
          uVar7 = pAVar3->nTruePos + iVar9;
          if (((((int)uVar7 < 0) || (pAVar3->vCos->nSize <= (int)uVar7)) ||
              (uVar10 = pAVar3->nTruePis + iVar9, (int)uVar10 < 0)) ||
             (pAVar3->vCis->nSize <= (int)uVar10)) goto LAB_006abd14;
          pAVar4 = p->pNodeToFrames
                   [*(int *)((long)pAVar3->vCos->pArray[uVar7] + 0x24) * p->nFrames + iVar2];
          p->pNodeToFrames
          [p->nFrames * *(int *)((long)pAVar3->vCis->pArray[uVar10] + 0x24) + iVar2 + 1] = pAVar4;
          Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe));
          iVar9 = iVar9 + 1;
          pAVar3 = p->pAig;
        } while (iVar9 < pAVar3->nRegs);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < p->pPars->nFramesK);
  }
  if (p->pPars->fVerbose != 0) {
    Bar_ProgressStop(p_00);
  }
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeBmc = p->timeBmc + lVar12 + lVar8;
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepBmc( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int i, f;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );

    // sweep internal nodes
    p->fRefined = 0;
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
        // sweep flops
        Saig_ManForEachLo( p->pAig, pObj, i )
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 1, NULL );
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            if ( p->pPars->fVerbose )
                Bar_ProgressUpdate( pProgress, Aig_ManObjNumMax(p->pAig) * f + i, NULL );
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 1, NULL );
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
            break;
        // transfer latch input to the latch outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return p->fRefined;
}